

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_mut_val * duckdb_yyjson::yyjson_val_mut_copy(yyjson_mut_doc *m_doc,yyjson_val *i_vals)

{
  yyjson_val_pool *pool;
  yyjson_str_pool *pool_00;
  yyjson_mut_val *pyVar1;
  uint64_t uVar2;
  void *__src;
  uint64_t *puVar3;
  byte bVar4;
  bool bVar5;
  yyjson_val *pyVar6;
  yyjson_mut_val *__dest;
  yyjson_mut_val *pyVar7;
  yyjson_mut_val *pyVar8;
  char *pcVar9;
  int64_t iVar10;
  ulong uVar11;
  yyjson_mut_val *pyVar12;
  
  if (i_vals != (yyjson_val *)0x0 && m_doc != (yyjson_mut_doc *)0x0) {
    if ((~(uint)i_vals->tag & 6) == 0) {
      iVar10 = (i_vals->uni).i64;
    }
    else {
      iVar10 = 0x10;
    }
    uVar11 = iVar10 >> 4;
    pool = &m_doc->val_pool;
    pyVar7 = (m_doc->val_pool).cur;
    if ((ulong)(((long)(m_doc->val_pool).end - (long)pyVar7) / 0x18) < uVar11) {
      bVar5 = unsafe_yyjson_val_pool_grow(pool,&m_doc->alc,uVar11);
      if (!bVar5) {
        return (yyjson_mut_val *)0x0;
      }
      pyVar7 = pool->cur;
    }
    pool->cur = pyVar7 + uVar11;
    if (pyVar7 != (yyjson_mut_val *)0x0) {
      if (iVar10 < 1) {
        return pyVar7;
      }
      puVar3 = &i_vals->tag;
      pool_00 = &m_doc->str_pool;
      pyVar12 = pyVar7;
      while( true ) {
        uVar2 = i_vals->tag;
        pyVar12->tag = uVar2;
        __src = (i_vals->uni).ptr;
        (pyVar12->uni).ptr = __src;
        bVar4 = (byte)uVar2;
        if ((bVar4 & 3) == 1) break;
        bVar4 = bVar4 & 7;
        if (bVar4 == 7) {
          uVar11 = i_vals->tag;
          if (0xff < uVar11) {
            pyVar1 = pyVar12 + 1;
            __dest = pyVar1;
            if (0x1ff < uVar11) {
              uVar11 = uVar11 >> 8;
              pyVar8 = pyVar1;
              pyVar6 = i_vals;
              do {
                pcVar9 = (char *)0x10;
                if ((~(uint)pyVar6[2].tag & 6) == 0) {
                  pcVar9 = pyVar6[2].uni.str;
                }
                uVar11 = uVar11 - 1;
                pyVar6 = (yyjson_val *)(pcVar9 + (long)&pyVar6[1].tag);
                __dest = pyVar8 + ((long)(pcVar9 + 0x10) >> 4);
                pyVar8->next = pyVar8 + 1;
                pyVar8[1].next = __dest;
                pyVar8 = __dest;
              } while (1 < uVar11);
            }
            __dest->next = __dest + 1;
            __dest[1].next = pyVar1;
            goto LAB_00cf03d9;
          }
        }
        else if ((bVar4 == 6) && (uVar11 = i_vals->tag, 0xff < uVar11)) {
          pyVar1 = pyVar12 + 1;
          __dest = pyVar1;
          if (0x1ff < uVar11) {
            pyVar6 = i_vals + 1;
            uVar11 = uVar11 >> 8;
            pyVar8 = pyVar1;
            do {
              pcVar9 = (char *)0x10;
              if ((~(uint)pyVar6->tag & 6) == 0) {
                pcVar9 = (pyVar6->uni).str;
              }
              uVar11 = uVar11 - 1;
              pyVar6 = (yyjson_val *)(pcVar9 + (long)&pyVar6->tag);
              __dest = pyVar8 + ((long)pcVar9 >> 4);
              pyVar8->next = __dest;
              pyVar8 = __dest;
            } while (1 < uVar11);
          }
          __dest->next = pyVar1;
LAB_00cf03d9:
          (pyVar12->uni).ptr = __dest;
        }
        i_vals = i_vals + 1;
        pyVar12 = pyVar12 + 1;
        if ((yyjson_val *)((long)puVar3 + iVar10) <= i_vals) {
          return pyVar7;
        }
      }
      uVar11 = i_vals->tag >> 8;
      __dest = (yyjson_mut_val *)(m_doc->str_pool).cur;
      if (uVar11 < (ulong)((long)(m_doc->str_pool).end - (long)__dest)) {
LAB_00cf03a7:
        pool_00->cur = (char *)((long)&__dest->tag + uVar11 + 1);
        if (__dest != (yyjson_mut_val *)0x0) {
          switchD_015de399::default(__dest,__src,uVar11);
          *(undefined1 *)((long)&__dest->tag + uVar11) = 0;
          goto LAB_00cf03d9;
        }
      }
      else {
        bVar5 = unsafe_yyjson_str_pool_grow(pool_00,&m_doc->alc,uVar11 + 1);
        if (bVar5) {
          __dest = (yyjson_mut_val *)pool_00->cur;
          goto LAB_00cf03a7;
        }
      }
      (pyVar12->uni).u64 = 0;
    }
  }
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_val_mut_copy(yyjson_mut_doc *m_doc,
                                    yyjson_val *i_vals) {
    /*
     The immutable object or array stores all sub-values in a contiguous memory,
     We copy them to another contiguous memory as mutable values,
     then reconnect the mutable values with the original relationship.
     */
    usize i_vals_len;
    yyjson_mut_val *m_vals, *m_val;
    yyjson_val *i_val, *i_end;

    if (!m_doc || !i_vals) return NULL;
    i_end = unsafe_yyjson_get_next(i_vals);
    i_vals_len = (usize)(unsafe_yyjson_get_next(i_vals) - i_vals);
    m_vals = unsafe_yyjson_mut_val(m_doc, i_vals_len);
    if (!m_vals) return NULL;
    i_val = i_vals;
    m_val = m_vals;

    for (; i_val < i_end; i_val++, m_val++) {
        yyjson_type type = unsafe_yyjson_get_type(i_val);
        m_val->tag = i_val->tag;
        m_val->uni.u64 = i_val->uni.u64;
        if (type == YYJSON_TYPE_STR || type == YYJSON_TYPE_RAW) {
            const char *str = i_val->uni.str;
            usize str_len = unsafe_yyjson_get_len(i_val);
            m_val->uni.str = unsafe_yyjson_mut_strncpy(m_doc, str, str_len);
            if (!m_val->uni.str) return NULL;
        } else if (type == YYJSON_TYPE_ARR) {
            usize len = unsafe_yyjson_get_len(i_val);
            if (len > 0) {
                yyjson_val *ii_val = i_val + 1, *ii_next;
                yyjson_mut_val *mm_val = m_val + 1, *mm_ctn = m_val, *mm_next;
                while (len-- > 1) {
                    ii_next = unsafe_yyjson_get_next(ii_val);
                    mm_next = mm_val + (ii_next - ii_val);
                    mm_val->next = mm_next;
                    ii_val = ii_next;
                    mm_val = mm_next;
                }
                mm_val->next = mm_ctn + 1;
                mm_ctn->uni.ptr = mm_val;
            }
        } else if (type == YYJSON_TYPE_OBJ) {
            usize len = unsafe_yyjson_get_len(i_val);
            if (len > 0) {
                yyjson_val *ii_key = i_val + 1, *ii_nextkey;
                yyjson_mut_val *mm_key = m_val + 1, *mm_ctn = m_val;
                yyjson_mut_val *mm_nextkey;
                while (len-- > 1) {
                    ii_nextkey = unsafe_yyjson_get_next(ii_key + 1);
                    mm_nextkey = mm_key + (ii_nextkey - ii_key);
                    mm_key->next = mm_key + 1;
                    mm_key->next->next = mm_nextkey;
                    ii_key = ii_nextkey;
                    mm_key = mm_nextkey;
                }
                mm_key->next = mm_key + 1;
                mm_key->next->next = mm_ctn + 1;
                mm_ctn->uni.ptr = mm_key;
            }
        }
    }

    return m_vals;
}